

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Spatializer.cpp
# Opt level: O1

int Spatializer::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  UnityAudioSpatializerData *pUVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  UnityComplexNumber *pUVar8;
  int n;
  long lVar9;
  long lVar10;
  float *pfVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  float *pfVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float __y;
  float spreadmatrix [2];
  float local_80 [2];
  undefined1 local_78 [16];
  long local_60;
  float *local_58;
  ulong local_50;
  float *local_48;
  UnityComplexNumber *local_40;
  UnityAudioEffectState *local_38;
  
  if ((((outchannels == 2 && inchannels == 2) && (0x4f < (state->field_0).field_0.structsize)) &&
      (0x102ff < (state->field_0).field_0.hostapiversion)) &&
     (pUVar5 = (state->field_0).field_0.spatializerdata, pUVar5 != (UnityAudioSpatializerData *)0x0)
     ) {
    pvVar6 = (state->field_0).field_0.effectdata;
    if (pvVar6 == (void *)0x0) {
      __assert_fail("effectdata",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                    ,0xfd,
                    "T *UnityAudioEffectState::GetEffectData() const [T = Spatializer::EffectData]")
      ;
    }
    if ((state->field_0).field_0.internal == (void *)0x0) {
      __assert_fail("internal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                    ,0xfe,
                    "T *UnityAudioEffectState::GetEffectData() const [T = Spatializer::EffectData]")
      ;
    }
    fVar1 = pUVar5->sourcematrix[0xc];
    fVar2 = pUVar5->sourcematrix[0xd];
    fVar18 = pUVar5->sourcematrix[0xe];
    __y = pUVar5->listenermatrix[8] * fVar18 +
          pUVar5->listenermatrix[0] * fVar1 + pUVar5->listenermatrix[4] * fVar2 +
          pUVar5->listenermatrix[0xc];
    fVar3 = pUVar5->listenermatrix[5];
    fVar19 = pUVar5->listenermatrix[1];
    fVar20 = pUVar5->listenermatrix[9];
    fVar4 = pUVar5->listenermatrix[0xd];
    local_78._0_4_ =
         fVar18 * pUVar5->listenermatrix[10] +
         fVar1 * pUVar5->listenermatrix[2] + fVar2 * pUVar5->listenermatrix[6] +
         pUVar5->listenermatrix[0xe];
    fVar17 = 0.0;
    if (0.001 <= ABS((float)local_78._0_4_)) {
      fVar17 = (float)local_78._0_4_;
      local_78 = ZEXT416((uint)local_78._0_4_);
      fVar17 = atan2f(__y,fVar17);
    }
    fVar17 = (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar17 |
                    (uint)(fVar17 + 6.2831855) & -(uint)(fVar17 < 0.0)) * 57.295776;
    auVar7 = ZEXT416((uint)(((ABS(fVar17) - ABS(fVar17 + -360.0)) + 360.0) * 0.5));
    fVar17 = __y * __y + (float)local_78._0_4_ * (float)local_78._0_4_;
    local_78 = auVar7;
    if (fVar17 < 0.0) {
      fVar17 = sqrtf(fVar17);
    }
    else {
      fVar17 = SQRT(fVar17);
    }
    fVar18 = atan2f(fVar20 * fVar18 + fVar19 * fVar1 + fVar3 * fVar2 + fVar4,fVar17 + 0.001);
    pUVar5 = (state->field_0).field_0.spatializerdata;
    fVar1 = pUVar5->spatialblend;
    fVar2 = pUVar5->reverbzonemix;
    local_40 = (UnityComplexNumber *)((long)pvVar6 + 0xc);
    uVar13 = 0;
    GetHRTF(0,local_40,(float)local_78._0_4_,fVar18 * 57.295776);
    GetHRTF(1,(UnityComplexNumber *)((long)pvVar6 + 0x700c),(float)local_78._0_4_,fVar18 * 57.295776
           );
    local_38 = state;
    local_80[1] = cosf((((state->field_0).field_0.spatializerdata)->spread * 3.1415927) / 360.0);
    local_80[0] = 2.0 - local_80[1];
    if (length != 0) {
      local_60 = (long)pvVar6 + 0x680c;
      pfVar15 = reverbmixbuffer;
      do {
        local_50 = uVar13;
        local_48 = outbuffer;
        local_58 = pfVar15;
        lVar10 = 0;
        pfVar11 = inbuffer;
        pvVar14 = pvVar6;
        lVar16 = local_60;
        do {
          pUVar8 = local_40;
          fVar18 = ((local_38->field_0).field_0.spatializerdata)->stereopan;
          fVar19 = fVar18;
          fVar3 = -fVar18;
          if (lVar10 != 0) {
            fVar19 = -fVar18;
            fVar3 = fVar18;
          }
          fVar18 = local_80[lVar10];
          fVar20 = *(float *)((long)local_80 + (ulong)(uint)((1 - (int)lVar10) * 4));
          lVar9 = 0;
          do {
            fVar4 = inbuffer[lVar9 * 2 + 1];
            fVar17 = inbuffer[lVar9 * 2];
            *(undefined4 *)(lVar16 + -0x800 + lVar9 * 4) = *(undefined4 *)(lVar16 + lVar9 * 4);
            *(float *)(lVar16 + lVar9 * 4) = fVar17 * fVar18 + fVar4 * fVar20;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x200);
          local_78._0_8_ = lVar10;
          lVar9 = -0x800;
          do {
            *(undefined4 *)((long)pvVar14 + lVar9 * 4 + 0x400c) =
                 *(undefined4 *)((long)pvVar14 + lVar9 * 2 + 0x700c);
            *(undefined4 *)((long)pvVar14 + lVar9 * 4 + 0x4010) = 0;
            lVar9 = lVar9 + 2;
          } while (lVar9 != 0);
          FFT::Forward(local_40 + lVar10 * 0xe00 + 0x400,0x400,false);
          lVar9 = 0x802;
          do {
            fVar18 = *(float *)((long)pvVar14 + lVar9 * 8 + -0x2004);
            fVar20 = *(float *)((long)pvVar14 + lVar9 * 8 + -0x4004);
            fVar4 = *(float *)((long)pvVar14 + lVar9 * 8 + -0x4000);
            fVar17 = *(float *)((long)pvVar14 + lVar9 * 8 + -0x2000);
            *(float *)((long)pvVar14 + lVar9 * 8 + -4) = fVar18 * fVar20 - fVar4 * fVar17;
            *(float *)((long)pvVar14 + lVar9 * 8) = fVar18 * fVar4 + fVar17 * fVar20;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0xc02);
          FFT::Backward(pUVar8 + lVar10 * 0xe00 + 0x800,0x400,false);
          lVar10 = 0;
          do {
            fVar20 = pfVar11[lVar10 * 2] * (1.0 - (ABS(fVar3 + 0.0) + fVar19 + 0.0) * 0.5);
            fVar18 = *(float *)((long)pvVar14 + lVar10 * 8 + 0x400c);
            fVar20 = ((fVar18 + fVar18) - fVar20) * fVar1 + fVar20;
            outbuffer[lVar10 * 2] = fVar20;
            pfVar15[lVar10 * 2] = fVar20 * fVar2 + pfVar15[lVar10 * 2];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x200);
          lVar10 = local_78._0_8_ + 1;
          lVar16 = lVar16 + 0x7000;
          pvVar14 = (void *)((long)pvVar14 + 0x7000);
          pfVar15 = pfVar15 + 1;
          outbuffer = outbuffer + 1;
          pfVar11 = pfVar11 + 1;
        } while (local_78._0_8_ == 0);
        inbuffer = inbuffer + 0x400;
        outbuffer = local_48 + 0x400;
        pfVar15 = local_58 + 0x400;
        uVar12 = (int)local_50 + 0x200;
        uVar13 = (ulong)uVar12;
      } while (uVar12 < length);
    }
  }
  else {
    memcpy(outbuffer,inbuffer,(ulong)(outchannels * length) << 2);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        // Check that I/O formats are right and that the host API supports this feature
        if (inchannels != 2 || outchannels != 2 ||
            !IsHostCompatible(state) || state->spatializerdata == NULL)
        {
            memcpy(outbuffer, inbuffer, length * outchannels * sizeof(float));
            return UNITY_AUDIODSP_OK;
        }

        EffectData* data = state->GetEffectData<EffectData>();

        static const float kRad2Deg = 180.0f / kPI;

        float* m = state->spatializerdata->listenermatrix;
        float* s = state->spatializerdata->sourcematrix;

        // Currently we ignore source orientation and only use the position
        float px = s[12];
        float py = s[13];
        float pz = s[14];

        float dir_x = m[0] * px + m[4] * py + m[8] * pz + m[12];
        float dir_y = m[1] * px + m[5] * py + m[9] * pz + m[13];
        float dir_z = m[2] * px + m[6] * py + m[10] * pz + m[14];

        float azimuth = (fabsf(dir_z) < 0.001f) ? 0.0f : atan2f(dir_x, dir_z);
        if (azimuth < 0.0f)
            azimuth += 2.0f * kPI;
        azimuth = FastClip(azimuth * kRad2Deg, 0.0f, 360.0f);

        float elevation = atan2f(dir_y, sqrtf(dir_x * dir_x + dir_z * dir_z) + 0.001f) * kRad2Deg;
        float spatialblend = state->spatializerdata->spatialblend;
        float reverbmix = state->spatializerdata->reverbzonemix;

        GetHRTF(0, data->ch[0].h, azimuth, elevation);
        GetHRTF(1, data->ch[1].h, azimuth, elevation);

        // From the FMOD documentation:
        //   A spread angle of 0 makes the stereo sound mono at the point of the 3D emitter.
        //   A spread angle of 90 makes the left part of the stereo sound place itself at 45 degrees to the left and the right part 45 degrees to the right.
        //   A spread angle of 180 makes the left part of the stero sound place itself at 90 degrees to the left and the right part 90 degrees to the right.
        //   A spread angle of 360 makes the stereo sound mono at the opposite speaker location to where the 3D emitter should be located (by moving the left part 180 degrees left and the right part 180 degrees right). So in this case, behind you when the sound should be in front of you!
        // Note that FMOD performs the spreading and panning in one go. We can't do this here due to the way that impulse-based spatialization works, so we perform the spread calculations on the left/right source signals before they enter the convolution processing.
        // That way we can still use it to control how the source signal downmixing takes place.
        float spread = cosf(state->spatializerdata->spread * kPI / 360.0f);
        float spreadmatrix[2] = { 2.0f - spread, spread };

        float* reverb = reverbmixbuffer;
        for (int sampleOffset = 0; sampleOffset < length; sampleOffset += HRTFLEN)
        {
            for (int c = 0; c < 2; c++)
            {
                // stereopan is in the [-1; 1] range, this acts the way fmod does it for stereo
                float stereopan = 1.0f - ((c == 0) ? FastMax(0.0f, state->spatializerdata->stereopan) : FastMax(0.0f, -state->spatializerdata->stereopan));

                InstanceChannel& ch = data->ch[c];

                for (int n = 0; n < HRTFLEN; n++)
                {
                    float left  = inbuffer[n * 2];
                    float right = inbuffer[n * 2 + 1];
                    ch.buffer[n] = ch.buffer[n + HRTFLEN];
                    ch.buffer[n + HRTFLEN] = left * spreadmatrix[c] + right * spreadmatrix[1 - c];
                }

                for (int n = 0; n < HRTFLEN * 2; n++)
                {
                    ch.x[n].re = ch.buffer[n];
                    ch.x[n].im = 0.0f;
                }

                FFT::Forward(ch.x, HRTFLEN * 2, false);

                for (int n = 0; n < HRTFLEN * 2; n++)
                    UnityComplexNumber::Mul<float, float, float>(ch.x[n], ch.h[n], ch.y[n]);

                FFT::Backward(ch.y, HRTFLEN * 2, false);

                for (int n = 0; n < HRTFLEN; n++)
                {
                    float s = inbuffer[n * 2 + c] * stereopan;
                    float y = s + (ch.y[n].re * GAINCORRECTION - s) * spatialblend;
                    outbuffer[n * 2 + c] = y;
                    reverb[n * 2 + c] += y * reverbmix;
                }
            }

            inbuffer += HRTFLEN * 2;
            outbuffer += HRTFLEN * 2;
            reverb += HRTFLEN * 2;
        }

        return UNITY_AUDIODSP_OK;
    }